

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_timeout.cc
# Opt level: O2

void __thiscall
absl::lts_20240722::synchronization_internal::KernelTimeout::KernelTimeout
          (KernelTimeout *this,Time t)

{
  long lVar1;
  uint64_t uVar2;
  long lVar3;
  
  if (t.rep_.rep_hi_ == (HiRep)0x7fffffffffffffff && t.rep_.rep_lo_ == 0xffffffff) {
    uVar2 = 0xffffffffffffffff;
  }
  else {
    lVar1 = absl::lts_20240722::ToUnixNanos(t);
    lVar3 = 0;
    if (0 < lVar1) {
      lVar3 = lVar1;
    }
    uVar2 = 0xffffffffffffffff;
    if (lVar1 != 0x7fffffffffffffff) {
      uVar2 = lVar3 * 2;
    }
  }
  this->rep_ = uVar2;
  return;
}

Assistant:

KernelTimeout::KernelTimeout(absl::Time t) {
  // `absl::InfiniteFuture()` is a common "no timeout" value and cheaper to
  // compare than convert.
  if (t == absl::InfiniteFuture()) {
    rep_ = kNoTimeout;
    return;
  }

  int64_t unix_nanos = absl::ToUnixNanos(t);

  // A timeout that lands before the unix epoch is converted to 0.
  // In theory implementations should expire these timeouts immediately.
  if (unix_nanos < 0) {
    unix_nanos = 0;
  }

  // Values greater than or equal to kMaxNanos are converted to infinite.
  if (unix_nanos >= kMaxNanos) {
    rep_ = kNoTimeout;
    return;
  }

  rep_ = static_cast<uint64_t>(unix_nanos) << 1;
}